

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventDispatcher.cpp
# Opt level: O0

int __thiscall EventDispatcher::remove(EventDispatcher *this,char *__filename)

{
  uint uVar1;
  SyncRetEventAgent1<EventDispatcher,_int,_Event_*> *this_00;
  ssize_t sVar2;
  TimerManager *this_01;
  size_t __n;
  void *__buf;
  int __flags;
  TimerManager *timerMan;
  SyncRetEventAgent1<EventDispatcher,_int,_Event_*> *e;
  Event *ev_local;
  EventDispatcher *this_local;
  
  uVar1 = (*(this->super_IEventDispatcher)._vptr_IEventDispatcher[7])();
  if ((uVar1 & 1) == 0) {
    this_00 = (SyncRetEventAgent1<EventDispatcher,_int,_Event_*> *)
              operator_new(0x38,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/EventDispatcher.cpp"
                           ,0xe7);
    __flags = (int)__filename;
    __n = 0;
    SyncRetEventAgent1<EventDispatcher,_int,_Event_*>::SyncRetEventAgent1
              (this_00,this,0x29,(Event *)0x0);
    Event::setPriority((Event *)this_00,1);
    sVar2 = SyncRetEventAgent<int>::send
                      ((SyncRetEventAgent<int> *)this_00,(int)this,__buf,__n,__flags);
    this_local._4_4_ = (int)sVar2;
  }
  else {
    this_01 = TimerManager::getInstance();
    TimerManager::removeTimedEvent(this_01,(Event *)__filename);
    EventQueue::Remove(&this->mQueue,(Event *)__filename);
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int EventDispatcher::remove( Event *ev )
{
	if (not isThreadCurrent())
	{
		SyncRetEventAgent1<EventDispatcher, int, Event*>* e = 
			jh_new SyncRetEventAgent1<EventDispatcher, int, Event*>
			(this, &EventDispatcher::remove, ev);

		// I am a bad person, but it's either this or make all
		// EventAgent's publicly inherit from Event (instead of
		// Protected inheritance), and that's a big ugly change for
		// little benefit.
		((Event*)e)->setPriority(PRIORITY_HIGH);

		return e->send(this);
	}

	//  It is important that we remove events from the TimerManager first.  
	//  This ensure that an event does not get dispatched to the queue after we
	//  clear the queue.
	TimerManager *timerMan = TimerManager::getInstance();
	timerMan->removeTimedEvent( ev );
	mQueue.Remove( ev );	
	return 0;
}